

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriterTests.cpp
# Opt level: O0

int testStorageWriterTestsSupportedTypes(void)

{
  AutoDeleteTempFile *this;
  allocator<unsigned_char> *this_00;
  allocator<MILBlob::Fp16> *this_01;
  allocator<float> *this_02;
  allocator<signed_char> *this_03;
  Span<const_signed_char,_18446744073709551615UL> expectedSpan_00;
  Span<const_signed_char,_18446744073709551615UL> data;
  initializer_list<signed_char> __l;
  Span<const_float,_18446744073709551615UL> expectedSpan_01;
  initializer_list<float> __l_00;
  Span<const_MILBlob::Fp16,_18446744073709551615UL> expectedSpan_02;
  initializer_list<MILBlob::Fp16> __l_01;
  Span<const_unsigned_char,_18446744073709551615UL> expectedSpan_03;
  initializer_list<unsigned_char> __l_02;
  bool bVar1;
  string *psVar2;
  ostream *poVar4;
  Span<const_unsigned_char,_18446744073709551615UL> SVar7;
  Span<const_MILBlob::Fp16,_18446744073709551615UL> SVar8;
  Span<const_float,_18446744073709551615UL> SVar9;
  Span<const_signed_char,_18446744073709551615UL> SVar10;
  StorageWriter local_238;
  StorageWriter writer_3;
  uint64_t offset_3;
  Span<const_signed_char,_18446744073709551615UL> expectedSpan_3;
  undefined1 local_200 [8];
  vector<signed_char,_std::allocator<signed_char>_> val_3;
  StorageWriter local_1c8;
  StorageWriter writer_2;
  uint64_t offset_2;
  Span<const_float,_18446744073709551615UL> expectedSpan_2;
  float local_1a0 [4];
  iterator local_190;
  size_type local_188;
  undefined1 local_180 [8];
  vector<float,_std::allocator<float>_> val_2;
  StorageWriter local_140;
  StorageWriter writer_1;
  uint64_t offset_1;
  Span<const_MILBlob::Fp16,_18446744073709551615UL> expectedSpan_1;
  Fp16 local_118;
  Fp16 local_116;
  Fp16 local_114;
  Fp16 local_112;
  iterator local_110;
  size_type local_108;
  undefined1 local_100 [8];
  vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> val_1;
  StorageWriter local_b8;
  StorageWriter writer;
  uint64_t offset;
  Span<const_unsigned_char,_18446744073709551615UL> expectedSpan;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> val;
  undefined1 local_58 [8];
  string filePath;
  AutoDeleteTempFile tempfile;
  pointer pFVar3;
  pointer ptVar5;
  pointer ptVar6;
  
  this = (AutoDeleteTempFile *)((long)&filePath.field_2 + 8);
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(this);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(this);
  std::__cxx11::string::string((string *)local_58,(string *)psVar2);
  expectedSpan.m_size.m_size._4_1_ = 1;
  expectedSpan.m_size.m_size._5_1_ = 0xde;
  expectedSpan.m_size.m_size._6_1_ = 0xad;
  expectedSpan.m_size.m_size._7_1_ = 0x10;
  this_00 = (allocator<unsigned_char> *)((long)&expectedSpan.m_size.m_size + 3);
  std::allocator<unsigned_char>::allocator(this_00);
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)((long)&expectedSpan.m_size.m_size + 4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,__l_02,this_00);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&expectedSpan.m_size.m_size + 3));
  SVar7 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  expectedSpan.m_ptr = (pointer)SVar7.m_size.m_size;
  pFVar3 = (pointer)SVar7.m_ptr;
  writer.m_impl._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl =
       (unique_ptr<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
        )(__uniq_ptr_data<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>,_true,_true>
          )0x0;
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)((long)&filePath.field_2 + 8));
  MILBlob::Blob::StorageWriter::StorageWriter(&local_b8,psVar2,true);
  SVar7.m_size.m_size = (size_t)expectedSpan.m_ptr;
  SVar7.m_ptr = (pointer)pFVar3;
  writer.m_impl._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl =
       (unique_ptr<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
        )MILBlob::Blob::StorageWriter::WriteData<unsigned_char>(&local_b8,SVar7);
  MILBlob::Blob::StorageWriter::~StorageWriter(&local_b8);
  if (((ulong)writer.m_impl._M_t.
              super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
              .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl &
      0x3f) == 0) {
    bVar1 = anon_unknown.dwarf_bde1d::IsCorrectHeader((string *)local_58,1);
    if (bVar1) {
      bVar1 = anon_unknown.dwarf_bde1d::IsCorrectMetadata<unsigned_char>
                        ((string *)local_58,
                         (uint64_t)
                         writer.m_impl._M_t.
                         super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                         .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>.
                         _M_head_impl,4,UInt8);
      if (bVar1) {
        expectedSpan_03.m_size.m_size = (size_t)expectedSpan.m_ptr;
        expectedSpan_03.m_ptr = (pointer)pFVar3;
        val_1.super__Vector_base<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pFVar3;
        bVar1 = anon_unknown.dwarf_bde1d::IsCorrectData<unsigned_char>
                          ((string *)local_58,
                           (uint64_t)
                           writer.m_impl._M_t.
                           super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                           .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>.
                           _M_head_impl,expectedSpan_03);
        if (bVar1) {
          bVar1 = false;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4e);
          poVar4 = std::operator<<(poVar4,": error: ");
          poVar4 = std::operator<<(poVar4,"IsCorrectData<uint8_t>(filePath, offset, expectedSpan)");
          poVar4 = std::operator<<(poVar4," was false, expected true.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          tempfile._36_4_ = 1;
          bVar1 = true;
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4d);
        poVar4 = std::operator<<(poVar4,": error: ");
        poVar4 = std::operator<<(poVar4,
                                 "IsCorrectMetadata<uint8_t>(filePath, offset, 4, BlobDataType::UInt8)"
                                );
        poVar4 = std::operator<<(poVar4," was false, expected true.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        tempfile._36_4_ = 1;
        bVar1 = true;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4c);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"IsCorrectHeader(filePath, 1 )");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      tempfile._36_4_ = 1;
      bVar1 = true;
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4b);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"(offset % DefaultStorageAlignment) == (uint64_t(0))");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    tempfile._36_4_ = 1;
    bVar1 = true;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  if (!bVar1) {
    MILBlob::Fp16::Fp16(&local_118,0x12);
    MILBlob::Fp16::Fp16(&local_116,0);
    MILBlob::Fp16::Fp16(&local_114,0x124);
    MILBlob::Fp16::Fp16(&local_112,0xabcd);
    local_110 = &local_118;
    local_108 = 4;
    this_01 = (allocator<MILBlob::Fp16> *)((long)&expectedSpan_1.m_size.m_size + 7);
    std::allocator<MILBlob::Fp16>::allocator(this_01);
    __l_01._M_len = local_108;
    __l_01._M_array = local_110;
    std::vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::vector
              ((vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)local_100,__l_01,this_01);
    std::allocator<MILBlob::Fp16>::~allocator
              ((allocator<MILBlob::Fp16> *)((long)&expectedSpan_1.m_size.m_size + 7));
    SVar8 = MILBlob::Util::MakeSpan<MILBlob::Fp16,_std::vector,_std::allocator<MILBlob::Fp16>_>
                      ((vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)local_100);
    expectedSpan_1.m_ptr = (pointer)SVar8.m_size.m_size;
    ptVar5 = SVar8.m_ptr;
    writer_1.m_impl._M_t.
    super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
    .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl =
         (unique_ptr<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
          )(__uniq_ptr_data<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>,_true,_true>
            )0x0;
    psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                       ((AutoDeleteTempFile *)((long)&filePath.field_2 + 8));
    MILBlob::Blob::StorageWriter::StorageWriter(&local_140,psVar2,false);
    SVar8.m_size.m_size = (size_t)expectedSpan_1.m_ptr;
    SVar8.m_ptr = ptVar5;
    writer_1.m_impl._M_t.
    super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
    ._M_t.
    super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
    .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl =
         (unique_ptr<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
          )MILBlob::Blob::StorageWriter::WriteData<MILBlob::Fp16>(&local_140,SVar8);
    MILBlob::Blob::StorageWriter::~StorageWriter(&local_140);
    if (((ulong)writer_1.m_impl._M_t.
                super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl &
        0x3f) == 0) {
      bVar1 = anon_unknown.dwarf_bde1d::IsCorrectHeader((string *)local_58,2);
      if (bVar1) {
        bVar1 = anon_unknown.dwarf_bde1d::IsCorrectMetadata<MILBlob::Fp16>
                          ((string *)local_58,
                           (uint64_t)
                           writer_1.m_impl._M_t.
                           super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                           .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>.
                           _M_head_impl,4,Float16);
        if (bVar1) {
          expectedSpan_02.m_size.m_size = (size_t)expectedSpan_1.m_ptr;
          expectedSpan_02.m_ptr = ptVar5;
          val_2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)ptVar5;
          bVar1 = anon_unknown.dwarf_bde1d::IsCorrectData<MILBlob::Fp16>
                            ((string *)local_58,
                             (uint64_t)
                             writer_1.m_impl._M_t.
                             super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                             .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>.
                             _M_head_impl,expectedSpan_02);
          if (bVar1) {
            bVar1 = false;
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,":");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5e);
            poVar4 = std::operator<<(poVar4,": error: ");
            poVar4 = std::operator<<(poVar4,"IsCorrectData<Fp16>(filePath, offset, expectedSpan)");
            poVar4 = std::operator<<(poVar4," was false, expected true.");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            tempfile._36_4_ = 1;
            bVar1 = true;
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5d);
          poVar4 = std::operator<<(poVar4,": error: ");
          poVar4 = std::operator<<(poVar4,
                                   "IsCorrectMetadata<Fp16>(filePath, offset, 4, BlobDataType::Float16)"
                                  );
          poVar4 = std::operator<<(poVar4," was false, expected true.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          tempfile._36_4_ = 1;
          bVar1 = true;
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5c);
        poVar4 = std::operator<<(poVar4,": error: ");
        poVar4 = std::operator<<(poVar4,"IsCorrectHeader(filePath, 2 )");
        poVar4 = std::operator<<(poVar4," was false, expected true.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        tempfile._36_4_ = 1;
        bVar1 = true;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x5b);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"(offset % DefaultStorageAlignment) == (uint64_t(0))");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      tempfile._36_4_ = 1;
      bVar1 = true;
    }
    std::vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_>::~vector
              ((vector<MILBlob::Fp16,_std::allocator<MILBlob::Fp16>_> *)local_100);
    if (!bVar1) {
      local_1a0[0] = 3.14;
      local_1a0[1] = 72.15352;
      local_1a0[2] = 703710.0;
      local_1a0[3] = 7.0;
      local_190 = local_1a0;
      local_188 = 4;
      this_02 = (allocator<float> *)((long)&expectedSpan_2.m_size.m_size + 7);
      std::allocator<float>::allocator(this_02);
      __l_00._M_len = local_188;
      __l_00._M_array = local_190;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_180,__l_00,this_02);
      std::allocator<float>::~allocator
                ((allocator<float> *)((long)&expectedSpan_2.m_size.m_size + 7));
      SVar9 = MILBlob::Util::MakeSpan<float,_std::vector,_std::allocator<float>_>
                        ((vector<float,_std::allocator<float>_> *)local_180);
      expectedSpan_2.m_ptr = (pointer)SVar9.m_size.m_size;
      ptVar6 = SVar9.m_ptr;
      writer_2.m_impl._M_t.
      super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
      .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl =
           (unique_ptr<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
            )(__uniq_ptr_data<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>,_true,_true>
              )0x0;
      psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                         ((AutoDeleteTempFile *)((long)&filePath.field_2 + 8));
      MILBlob::Blob::StorageWriter::StorageWriter(&local_1c8,psVar2,false);
      SVar9.m_size.m_size = (size_t)expectedSpan_2.m_ptr;
      SVar9.m_ptr = ptVar6;
      writer_2.m_impl._M_t.
      super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
      .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl =
           (unique_ptr<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
            )MILBlob::Blob::StorageWriter::WriteData<float>(&local_1c8,SVar9);
      MILBlob::Blob::StorageWriter::~StorageWriter(&local_1c8);
      if (((ulong)writer_2.m_impl._M_t.
                  super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                  .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl &
          0x3f) == 0) {
        bVar1 = anon_unknown.dwarf_bde1d::IsCorrectHeader((string *)local_58,3);
        if (bVar1) {
          bVar1 = anon_unknown.dwarf_bde1d::IsCorrectMetadata<float>
                            ((string *)local_58,
                             (uint64_t)
                             writer_2.m_impl._M_t.
                             super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                             .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>.
                             _M_head_impl,4,Float32);
          if (bVar1) {
            expectedSpan_01.m_size.m_size = (size_t)expectedSpan_2.m_ptr;
            expectedSpan_01.m_ptr = ptVar6;
            val_3.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)ptVar6;
            bVar1 = anon_unknown.dwarf_bde1d::IsCorrectData<float>
                              ((string *)local_58,
                               (uint64_t)
                               writer_2.m_impl._M_t.
                               super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                               .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>.
                               _M_head_impl,expectedSpan_01);
            if (bVar1) {
              bVar1 = false;
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                      );
              poVar4 = std::operator<<(poVar4,":");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x6e);
              poVar4 = std::operator<<(poVar4,": error: ");
              poVar4 = std::operator<<(poVar4,"IsCorrectData<float>(filePath, offset, expectedSpan)"
                                      );
              poVar4 = std::operator<<(poVar4," was false, expected true.");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              tempfile._36_4_ = 1;
              bVar1 = true;
            }
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,":");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x6d);
            poVar4 = std::operator<<(poVar4,": error: ");
            poVar4 = std::operator<<(poVar4,
                                     "IsCorrectMetadata<float>(filePath, offset, 4, BlobDataType::Float32)"
                                    );
            poVar4 = std::operator<<(poVar4," was false, expected true.");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            tempfile._36_4_ = 1;
            bVar1 = true;
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x6c);
          poVar4 = std::operator<<(poVar4,": error: ");
          poVar4 = std::operator<<(poVar4,"IsCorrectHeader(filePath, 3 )");
          poVar4 = std::operator<<(poVar4," was false, expected true.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          tempfile._36_4_ = 1;
          bVar1 = true;
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x6b);
        poVar4 = std::operator<<(poVar4,": error: ");
        poVar4 = std::operator<<(poVar4,"(offset % DefaultStorageAlignment) == (uint64_t(0))");
        poVar4 = std::operator<<(poVar4," was false, expected true.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        tempfile._36_4_ = 1;
        bVar1 = true;
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_180);
      if (!bVar1) {
        expectedSpan_3.m_size.m_size._4_1_ = 1;
        expectedSpan_3.m_size.m_size._5_1_ = 0xff;
        expectedSpan_3.m_size.m_size._6_1_ = 10;
        expectedSpan_3.m_size.m_size._7_1_ = 0xe7;
        this_03 = (allocator<signed_char> *)((long)&expectedSpan_3.m_size.m_size + 3);
        std::allocator<signed_char>::allocator(this_03);
        __l._M_len = 4;
        __l._M_array = (iterator)((long)&expectedSpan_3.m_size.m_size + 4);
        std::vector<signed_char,_std::allocator<signed_char>_>::vector
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_200,__l,this_03);
        std::allocator<signed_char>::~allocator
                  ((allocator<signed_char> *)((long)&expectedSpan_3.m_size.m_size + 3));
        SVar10 = MILBlob::Util::MakeSpan<signed_char,_std::vector,_std::allocator<signed_char>_>
                           ((vector<signed_char,_std::allocator<signed_char>_> *)local_200);
        expectedSpan_3.m_ptr = (pointer)SVar10.m_size.m_size;
        writer_3.m_impl._M_t.
        super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
        .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl =
             (unique_ptr<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
              )(__uniq_ptr_data<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>,_true,_true>
                )0x0;
        psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                           ((AutoDeleteTempFile *)((long)&filePath.field_2 + 8));
        MILBlob::Blob::StorageWriter::StorageWriter(&local_238,psVar2,false);
        data.m_size.m_size = (size_t)expectedSpan_3.m_ptr;
        data.m_ptr = SVar10.m_ptr;
        writer_3.m_impl._M_t.
        super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
        .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl =
             (unique_ptr<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
              )MILBlob::Blob::StorageWriter::WriteData<signed_char>(&local_238,data);
        MILBlob::Blob::StorageWriter::~StorageWriter(&local_238);
        if (((ulong)writer_3.m_impl._M_t.
                    super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                    .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>._M_head_impl
            & 0x3f) == 0) {
          bVar1 = anon_unknown.dwarf_bde1d::IsCorrectHeader((string *)local_58,4);
          if (bVar1) {
            bVar1 = anon_unknown.dwarf_bde1d::IsCorrectMetadata<signed_char>
                              ((string *)local_58,
                               (uint64_t)
                               writer_3.m_impl._M_t.
                               super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                               .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>.
                               _M_head_impl,4,Int8);
            if (bVar1) {
              expectedSpan_00.m_size.m_size = (size_t)expectedSpan_3.m_ptr;
              expectedSpan_00.m_ptr = SVar10.m_ptr;
              bVar1 = anon_unknown.dwarf_bde1d::IsCorrectData<signed_char>
                                ((string *)local_58,
                                 (uint64_t)
                                 writer_3.m_impl._M_t.
                                 super___uniq_ptr_impl<MILBlob::Blob::StorageWriter::Impl,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_std::default_delete<MILBlob::Blob::StorageWriter::Impl>_>
                                 .super__Head_base<0UL,_MILBlob::Blob::StorageWriter::Impl_*,_false>
                                 ._M_head_impl,expectedSpan_00);
              if (bVar1) {
                bVar1 = false;
              }
              else {
                poVar4 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                        );
                poVar4 = std::operator<<(poVar4,":");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7e);
                poVar4 = std::operator<<(poVar4,": error: ");
                poVar4 = std::operator<<(poVar4,
                                         "IsCorrectData<int8_t>(filePath, offset, expectedSpan)");
                poVar4 = std::operator<<(poVar4," was false, expected true.");
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                tempfile._36_4_ = 1;
                bVar1 = true;
              }
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                      );
              poVar4 = std::operator<<(poVar4,":");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7d);
              poVar4 = std::operator<<(poVar4,": error: ");
              poVar4 = std::operator<<(poVar4,
                                       "IsCorrectMetadata<int8_t>(filePath, offset, 4, BlobDataType::Int8)"
                                      );
              poVar4 = std::operator<<(poVar4," was false, expected true.");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              tempfile._36_4_ = 1;
              bVar1 = true;
            }
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,":");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7c);
            poVar4 = std::operator<<(poVar4,": error: ");
            poVar4 = std::operator<<(poVar4,"IsCorrectHeader(filePath, 4 )");
            poVar4 = std::operator<<(poVar4," was false, expected true.");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            tempfile._36_4_ = 1;
            bVar1 = true;
          }
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageWriterTests.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x7b);
          poVar4 = std::operator<<(poVar4,": error: ");
          poVar4 = std::operator<<(poVar4,"(offset % DefaultStorageAlignment) == (uint64_t(0))");
          poVar4 = std::operator<<(poVar4," was false, expected true.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          tempfile._36_4_ = 1;
          bVar1 = true;
        }
        std::vector<signed_char,_std::allocator<signed_char>_>::~vector
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_200);
        if (!bVar1) {
          tempfile._36_4_ = 0;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_58);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile
            ((AutoDeleteTempFile *)((long)&filePath.field_2 + 8));
  return tempfile._36_4_;
}

Assistant:

int testStorageWriterTestsSupportedTypes()
{
    AutoDeleteTempFile tempfile;
    auto filePath = tempfile.GetFilename();

    // Writing uint8_t values
    {
        const std::vector<uint8_t> val = {0x01, 0xde, 0xad, 0x10};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename());
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 1 /*count*/));
        ML_ASSERT(IsCorrectMetadata<uint8_t>(filePath, offset, 4, BlobDataType::UInt8));
        ML_ASSERT(IsCorrectData<uint8_t>(filePath, offset, expectedSpan));
    }

    // Writing fp16 values
    {
        const std::vector<Fp16> val = {Fp16(0x12), Fp16(0x00), Fp16(0x124), Fp16(0xabcd)};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 2 /*count*/));
        ML_ASSERT(IsCorrectMetadata<Fp16>(filePath, offset, 4, BlobDataType::Float16));
        ML_ASSERT(IsCorrectData<Fp16>(filePath, offset, expectedSpan));
    }

    // Writing fp32 values
    {
        const std::vector<float> val = {3.14f, 72.1535155f, 0xabcde, 0x007};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 3 /*count*/));
        ML_ASSERT(IsCorrectMetadata<float>(filePath, offset, 4, BlobDataType::Float32));
        ML_ASSERT(IsCorrectData<float>(filePath, offset, expectedSpan));
    }

    // Writing int8 values
    {
        const std::vector<int8_t> val = {1, -1, 10, -25};
        auto expectedSpan = Util::MakeSpan(val);
        uint64_t offset = 0;
        {
            StorageWriter writer(tempfile.GetFilename(), /* truncateFile */ false);
            offset = writer.WriteData(expectedSpan);
        }

        ML_ASSERT_EQ(offset % DefaultStorageAlignment, uint64_t(0));
        ML_ASSERT(IsCorrectHeader(filePath, 4 /*count*/));
        ML_ASSERT(IsCorrectMetadata<int8_t>(filePath, offset, 4, BlobDataType::Int8));
        ML_ASSERT(IsCorrectData<int8_t>(filePath, offset, expectedSpan));
    }

    return 0;
}